

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackend::start(CudaBackend *this,IWorker *worker,bool ready)

{
  bool bVar1;
  byte in_DL;
  long *in_RSI;
  mutex *in_RDI;
  undefined7 in_stack_00000010;
  undefined1 in_stack_ffffffffffffffdf;
  
  std::mutex::lock(in_RDI);
  bVar1 = CudaLaunchStatus::started
                    ((CudaLaunchStatus *)
                     (*(long *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) + 8),
                     (bool)(in_DL & 1));
  if (bVar1) {
    CudaLaunchStatus::print((CudaLaunchStatus *)CONCAT17(ready,in_stack_00000010));
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffdf);
  }
  std::mutex::unlock((mutex *)0x22374c);
  if ((bool)(in_DL & 1) != false) {
    (**(code **)(*in_RSI + 0x40))();
  }
  return;
}

Assistant:

void xmrig::CudaBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(ready)) {
        d_ptr->status.print();

        CudaWorker::ready = true;
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}